

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_scaling_operations.c
# Opt level: O2

void WebRtcSpl_ScaleAndAddVectors
               (int16_t *in1,int16_t gain1,int shift1,int16_t *in2,int16_t gain2,int shift2,
               int16_t *out,size_t vector_length)

{
  size_t sVar1;
  undefined2 in_register_00000032;
  undefined2 in_register_00000082;
  
  for (sVar1 = 0; vector_length != sVar1; sVar1 = sVar1 + 1) {
    out[sVar1] = (short)((int)in2[sVar1] * CONCAT22(in_register_00000082,gain2) >>
                        ((byte)shift2 & 0x1f)) +
                 (short)((int)in1[sVar1] * CONCAT22(in_register_00000032,gain1) >>
                        ((byte)shift1 & 0x1f));
  }
  return;
}

Assistant:

void WebRtcSpl_ScaleAndAddVectors(const int16_t *in1, int16_t gain1, int shift1,
                                  const int16_t *in2, int16_t gain2, int shift2,
                                  int16_t *out, size_t vector_length)
{
    // Performs vector operation: out = (gain1*in1)>>shift1 + (gain2*in2)>>shift2
    size_t i;
    const int16_t *in1ptr;
    const int16_t *in2ptr;
    int16_t *outptr;

    in1ptr = in1;
    in2ptr = in2;
    outptr = out;

    for (i = 0; i < vector_length; i++)
    {
      *outptr++ = (int16_t)((gain1 * *in1ptr++) >> shift1) +
          (int16_t)((gain2 * *in2ptr++) >> shift2);
    }
}